

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

CTypeID crec_bit64_type(CTState *cts,cTValue *tv)

{
  CType *local_58;
  CType *ct;
  cTValue *tv_local;
  CTState *cts_local;
  
  if ((int)(tv->field_4).it >> 0xf == -0xb) {
    local_58 = lj_ctype_rawref(cts,(uint)*(ushort *)((tv->u64 & 0x7fffffffffff) + 10));
    if (local_58->info >> 0x1c == 5) {
      local_58 = cts->tab + (local_58->info & 0xffff);
    }
    if (((local_58->info & 0xfc800000) == 0x800000) && (local_58->size == 8)) {
      cts_local._4_4_ = 0xc;
    }
    else {
      cts_local._4_4_ = 0xb;
    }
  }
  else {
    cts_local._4_4_ = 0;
  }
  return cts_local._4_4_;
}

Assistant:

static CTypeID crec_bit64_type(CTState *cts, cTValue *tv)
{
  if (tviscdata(tv)) {
    CType *ct = lj_ctype_rawref(cts, cdataV(tv)->ctypeid);
    if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
    if ((ct->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && ct->size == 8)
      return CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    return CTID_INT64;  /* Otherwise use int64_t. */
  }
  return 0;  /* Use regular 32 bit ops. */
}